

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::freeData
          (Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *this)

{
  Entry *pEVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  
  if (this->entries != (Entry *)0x0) {
    lVar4 = 0;
    do {
      uVar3 = (ulong)this->offsets[lVar4];
      if (uVar3 != 0xff) {
        pEVar1 = this->entries;
        QCache<QByteArray,_QTzTimeZoneCacheEntry>::Value::~Value
                  ((Value *)(pEVar1[uVar3].storage.data + 0x28));
        piVar2 = *(int **)(pEVar1[uVar3].storage.data + 0x10);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)(pEVar1[uVar3].storage.data + 0x10),1,0x10);
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }